

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void __thiscall
VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>>::
Unser<AutoFile,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
          (VectorFormatter<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>_> *this,
          AutoFile *s,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *v)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  unsigned_long *puVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  AutoFile *in_RDX;
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *in_RSI;
  long in_FS_OFFSET;
  size_t allocated;
  size_t size;
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> formatter;
  bool in_stack_00000047;
  AutoFile *in_stack_00000048;
  VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *in_stack_ffffffffffffffb8;
  vector<double,_std::allocator<double>_> *v_00;
  size_type in_stack_fffffffffffffff0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  
  this_00 = *(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              **)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)in_stack_ffffffffffffffb8);
  pvVar1 = (vector<double,_std::allocator<double>_> *)
           ReadCompactSize<AutoFile>(in_stack_00000048,in_stack_00000047);
  v_00 = (vector<double,_std::allocator<double>_> *)0x0;
  while (v_00 < pvVar1) {
    puVar2 = std::min<unsigned_long>
                       ((unsigned_long *)v_00,(unsigned_long *)in_stack_ffffffffffffffb8);
    v_00 = (vector<double,_std::allocator<double>_> *)*puVar2;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::reserve(this_00,in_stack_fffffffffffffff0);
    while (pvVar3 = (vector<double,_std::allocator<double>_> *)
                    std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::size((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *)in_stack_ffffffffffffffb8), pvVar3 < v_00) {
      in_stack_ffffffffffffffb8 = in_RSI;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::emplace_back<>((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)in_RDX);
      in_RSI = in_stack_ffffffffffffffb8;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_ffffffffffffffb8);
      VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
      Unser<AutoFile,std::vector<double,std::allocator<double>>>(in_RSI,in_RDX,v_00);
    }
  }
  if (*(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unser(Stream& s, V& v)
    {
        Formatter formatter;
        v.clear();
        size_t size = ReadCompactSize(s);
        size_t allocated = 0;
        while (allocated < size) {
            // For DoS prevention, do not blindly allocate as much as the stream claims to contain.
            // Instead, allocate in 5MiB batches, so that an attacker actually needs to provide
            // X MiB of data to make us allocate X+5 Mib.
            static_assert(sizeof(typename V::value_type) <= MAX_VECTOR_ALLOCATE, "Vector element size too large");
            allocated = std::min(size, allocated + MAX_VECTOR_ALLOCATE / sizeof(typename V::value_type));
            v.reserve(allocated);
            while (v.size() < allocated) {
                v.emplace_back();
                formatter.Unser(s, v.back());
            }
        }
    }